

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_indexed_indirect_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_106216::CpuIndexedIndirectTest::run_instruction
          (CpuIndexedIndirectTest *this,uint8_t instruction)

{
  uint16_t uVar1;
  ushort uVar2;
  code *pcVar3;
  byte bVar4;
  bool bVar5;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar6;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar7;
  char *message;
  AssertHelper local_270;
  Message local_268;
  undefined1 local_260 [8];
  AssertionResult gtest_ar;
  Action<unsigned_char_(unsigned_short)> local_240;
  WithoutMatchers local_219;
  Matcher<unsigned_short> local_218;
  MockSpec<unsigned_char_(unsigned_short)> local_200;
  ReturnAction<int> local_1e0;
  Action<unsigned_char_(unsigned_short)> local_1d0;
  WithoutMatchers local_1a9;
  Matcher<unsigned_short> local_1a8;
  MockSpec<unsigned_char_(unsigned_short)> local_190;
  ReturnAction<int> local_170;
  Action<unsigned_char_(unsigned_short)> local_160;
  WithoutMatchers local_139;
  Matcher<unsigned_short> local_138;
  MockSpec<unsigned_char_(unsigned_short)> local_120;
  ReturnAction<int> local_100;
  Action<unsigned_char_(unsigned_short)> local_f0;
  WithoutMatchers local_c9;
  Matcher<unsigned_short> local_c8;
  MockSpec<unsigned_char_(unsigned_short)> local_b0;
  ReturnAction<int> local_90;
  Action<unsigned_char_(unsigned_short)> local_80;
  WithoutMatchers local_5d [13];
  Matcher<unsigned_short> local_50;
  MockSpec<unsigned_char_(unsigned_short)> local_38;
  uint8_t local_11;
  CpuIndexedIndirectTest *pCStack_10;
  uint8_t instruction_local;
  CpuIndexedIndirectTest *this_local;
  
  uVar1 = *(uint16_t *)&(this->super_CpuTest).field_0x112;
  (this->super_CpuTest).expected.pc = uVar1;
  (this->super_CpuTest).registers.pc = uVar1;
  (this->super_CpuTest).expected.x = 0xed;
  (this->super_CpuTest).registers.x = 0xed;
  local_11 = instruction;
  pCStack_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,instruction);
  uVar2 = (this->super_CpuTest).expected.pc;
  if (!SCARRY4((uint)uVar2,1)) {
    (this->super_CpuTest).expected.pc = uVar2 + 1;
    testing::Matcher<unsigned_short>::Matcher
              (&local_50,*(short *)&(this->super_CpuTest).field_0x112 + 1);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_38,&(this->super_CpuTest).mmu.super_MockMmu,&local_50);
    testing::internal::GetWithoutMatchers();
    pMVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_38,local_5d,(void *)0x0);
    pTVar7 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_indexed_indirect_instructions.cpp"
                        ,0x15,"mmu","read_byte(start_pc + 1u)");
    testing::Return<int>((testing *)&local_90,0xab);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_80,(ReturnAction *)&local_90);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar7,&local_80);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_80);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_90);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_38);
    testing::Matcher<unsigned_short>::~Matcher(&local_50);
    testing::Matcher<unsigned_short>::Matcher(&local_c8,0xab);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_b0,&(this->super_CpuTest).mmu.super_MockMmu,&local_c8);
    testing::internal::GetWithoutMatchers();
    pMVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_b0,&local_c9,(void *)0x0);
    pTVar7 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_indexed_indirect_instructions.cpp"
                        ,0x16,"mmu","read_byte(0xAB)");
    testing::Return<int>((testing *)&local_100,0x68);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_f0,(ReturnAction *)&local_100);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar7,&local_f0);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_f0);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_100);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_b0);
    testing::Matcher<unsigned_short>::~Matcher(&local_c8);
    bVar4 = n_e_s::core::test::u16_to_u8(0x198);
    testing::Matcher<unsigned_short>::Matcher(&local_138,(ushort)bVar4);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_120,&(this->super_CpuTest).mmu.super_MockMmu,&local_138);
    testing::internal::GetWithoutMatchers();
    pMVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_120,&local_139,(void *)0x0);
    pTVar7 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_indexed_indirect_instructions.cpp"
                        ,0x17,"mmu","read_byte(u16_to_u8(0xAB + 0xED))");
    testing::Return<int>((testing *)&local_170,0x34);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_160,(ReturnAction *)&local_170);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar7,&local_160)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_160);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_170);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_120);
    testing::Matcher<unsigned_short>::~Matcher(&local_138);
    bVar4 = n_e_s::core::test::u16_to_u8(0x199);
    testing::Matcher<unsigned_short>::Matcher(&local_1a8,(ushort)bVar4);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_190,&(this->super_CpuTest).mmu.super_MockMmu,&local_1a8);
    testing::internal::GetWithoutMatchers();
    pMVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_190,&local_1a9,(void *)0x0);
    pTVar7 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_indexed_indirect_instructions.cpp"
                        ,0x19,"mmu","read_byte(u16_to_u8(0xAB + 0xED + 1u))");
    testing::Return<int>((testing *)&local_1e0,0x12);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_1d0,(ReturnAction *)&local_1e0);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar7,&local_1d0)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_1d0);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_1e0);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_190);
    testing::Matcher<unsigned_short>::~Matcher(&local_1a8);
    testing::Matcher<unsigned_short>::Matcher(&local_218,0x1234);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_200,&(this->super_CpuTest).mmu.super_MockMmu,&local_218);
    testing::internal::GetWithoutMatchers();
    pMVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_200,&local_219,(void *)0x0);
    pTVar7 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_indexed_indirect_instructions.cpp"
                        ,0x1b,"mmu","read_byte(0x1234)");
    testing::Return<unsigned_char>((testing *)&gtest_ar.message_,(this->super_CpuTest).field_0x114);
    testing::internal::ReturnAction::operator_cast_to_Action
              (&local_240,(ReturnAction *)&gtest_ar.message_);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar7,&local_240)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_240);
    testing::internal::ReturnAction<unsigned_char>::~ReturnAction
              ((ReturnAction<unsigned_char> *)&gtest_ar.message_);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_200);
    testing::Matcher<unsigned_short>::~Matcher(&local_218);
    n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x06');
    testing::internal::EqHelper::
    Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
              ((EqHelper *)local_260,"expected","registers",&(this->super_CpuTest).expected,
               &(this->super_CpuTest).registers);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
    if (!bVar5) {
      testing::Message::Message(&local_268);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_260);
      testing::internal::AssertHelper::AssertHelper
                (&local_270,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_indexed_indirect_instructions.cpp"
                 ,0x1e,message);
      testing::internal::AssertHelper::operator=(&local_270,&local_268);
      testing::internal::AssertHelper::~AssertHelper(&local_270);
      testing::Message::~Message(&local_268);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
    return;
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void run_instruction(uint8_t instruction) {
        registers.pc = expected.pc = start_pc;
        registers.x = expected.x = 0xED;
        stage_instruction(instruction);
        expected.pc += 1;

        EXPECT_CALL(mmu, read_byte(start_pc + 1u)).WillOnce(Return(0xAB));
        EXPECT_CALL(mmu, read_byte(0xAB)).WillOnce(Return(0x68)); // Dummy read
        EXPECT_CALL(mmu, read_byte(u16_to_u8(0xAB + 0xED)))
                .WillOnce(Return(0x34));
        EXPECT_CALL(mmu, read_byte(u16_to_u8(0xAB + 0xED + 1u)))
                .WillOnce(Return(0x12));
        EXPECT_CALL(mmu, read_byte(0x1234)).WillOnce(Return(memory_content));

        step_execution(6);
        EXPECT_EQ(expected, registers);
    }